

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_accessors.c
# Opt level: O1

void aec_get_rsi_lsb_32(aec_stream *strm)

{
  size_t __n;
  
  __n = (size_t)(int)(strm->rsi * strm->block_size * 4);
  memcpy(strm->state->data_raw,strm->next_in,__n);
  strm->next_in = strm->next_in + __n;
  strm->avail_in = strm->avail_in - __n;
  return;
}

Assistant:

void aec_get_rsi_lsb_32(struct aec_stream *strm)
{
    uint32_t *restrict out = strm->state->data_raw;
    const unsigned char *restrict in = strm->next_in;
    int rsi = strm->rsi * strm->block_size;

    for (int i = 0; i < rsi; i++)
        out[i] = (uint32_t)in[4 * i]
            | ((uint32_t)in[4 * i + 1] << 8)
            | ((uint32_t)in[4 * i + 2] << 16)
            | ((uint32_t)in[4 * i + 3] << 24);

    strm->next_in += 4 * rsi;
    strm->avail_in -= 4 * rsi;
}